

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O1

bool __thiscall
SQCompilation::CodegenVisitor::CheckMemberUniqueness
          (CodegenVisitor *this,ArenaVector<SQCompilation::Expr_*> *vec,Expr *obj)

{
  TreeOp TVar1;
  uint uVar2;
  Expr *pEVar3;
  int iVar4;
  int iVar5;
  Expr **__dest;
  _func_int **pp_Var6;
  ulong uVar7;
  ulong uVar8;
  LiteralExpr *a;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  LiteralExpr *b;
  char b_1 [32];
  _func_int *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  TVar1 = (obj->super_Node)._op;
  if ((TVar1 == TO_LITERAL) || (TVar1 == TO_ID)) {
    uVar7 = (ulong)vec->_size;
    bVar9 = uVar7 != 0;
    if (bVar9) {
      uVar8 = 1;
      do {
        pEVar3 = vec->_vals[uVar8 - 1];
        TVar1 = (pEVar3->super_Node)._op;
        if (TVar1 == TO_LITERAL) {
          bVar11 = false;
          if ((obj->super_Node)._op == TO_LITERAL) {
            iVar4 = *(int *)&(pEVar3->super_Node).field_0x1c;
            bVar11 = false;
            if (iVar4 == *(int *)&(obj->super_Node).field_0x1c) {
              if (iVar4 == 0) {
                iVar5 = strcmp((char *)pEVar3[1].super_Node.super_ArenaObj._vptr_ArenaObj,
                               (char *)obj[1].super_Node.super_ArenaObj._vptr_ArenaObj);
                bVar10 = iVar5 == 0;
              }
              else {
                bVar10 = pEVar3[1].super_Node.super_ArenaObj._vptr_ArenaObj ==
                         obj[1].super_Node.super_ArenaObj._vptr_ArenaObj;
              }
              if (bVar10) {
                if (iVar4 == 0) {
                  pp_Var6 = pEVar3[1].super_Node.super_ArenaObj._vptr_ArenaObj;
                }
                else {
                  local_48 = 0;
                  uStack_40 = 0;
                  local_58 = (_func_int *)0x0;
                  uStack_50 = 0;
                  pp_Var6 = &local_58;
                  snprintf((char *)pp_Var6,0x20,"%lu",
                           pEVar3[1].super_Node.super_ArenaObj._vptr_ArenaObj);
                }
                reportDiagnostic(this,&obj->super_Node,0x30,pp_Var6);
                bVar11 = true;
              }
            }
          }
        }
        else {
          bVar11 = false;
          if ((TVar1 == TO_ID) && ((obj->super_Node)._op == TO_ID)) {
            pp_Var6 = obj[1].super_Node.super_ArenaObj._vptr_ArenaObj;
            iVar4 = strcmp((char *)pEVar3[1].super_Node.super_ArenaObj._vptr_ArenaObj,
                           (char *)pp_Var6);
            bVar11 = false;
            if (iVar4 == 0) {
              reportDiagnostic(this,&obj->super_Node,0x30,pp_Var6);
              bVar11 = true;
            }
          }
        }
        if (bVar11) {
          if (bVar9) {
            return false;
          }
          break;
        }
        bVar9 = uVar8 < uVar7;
        bVar11 = uVar8 != uVar7;
        uVar8 = uVar8 + 1;
      } while (bVar11);
    }
    if (vec->_allocated <= vec->_size) {
      uVar2 = vec->_size * 2;
      uVar7 = 4;
      if (uVar2 != 0) {
        uVar7 = (ulong)uVar2;
      }
      __dest = (Expr **)Arena::allocate(vec->_arena,uVar7 * 8);
      memcpy(__dest,vec->_vals,(ulong)vec->_size << 3);
      vec->_vals = __dest;
      vec->_allocated = (size_type_conflict)uVar7;
    }
    uVar2 = vec->_size;
    vec->_size = uVar2 + 1;
    vec->_vals[uVar2] = obj;
  }
  return true;
}

Assistant:

bool CodegenVisitor::CheckMemberUniqueness(ArenaVector<Expr *> &vec, Expr *obj) {

    if (obj->op() != TO_LITERAL && obj->op() != TO_ID) return true;

    for (SQUnsignedInteger i = 0, n = vec.size(); i < n; ++i) {
        Expr *vecobj = vec[i];
        if (vecobj->op() == TO_ID && obj->op() == TO_ID) {
            if (strcmp(vecobj->asId()->id(), obj->asId()->id()) == 0) {
                reportDiagnostic(obj, DiagnosticsId::DI_DUPLICATE_KEY, obj->asId()->id());
                return false;
            }
            continue;
        }
        if (vecobj->op() == TO_LITERAL && obj->op() == TO_LITERAL) {
            LiteralExpr *a = (LiteralExpr*)vecobj;
            LiteralExpr *b = (LiteralExpr*)obj;
            if (compareLiterals(a, b)) {
                if (a->kind() == LK_STRING) {
                    reportDiagnostic(obj, DiagnosticsId::DI_DUPLICATE_KEY, a->s());
                }
                else {
                    char b[32] = { 0 };
                    snprintf(b, sizeof b, "%" SQ_UINT_FMT, a->raw());
                    reportDiagnostic(obj, DiagnosticsId::DI_DUPLICATE_KEY, b);
                }
                return false;
            }
            continue;
        }
    }

    vec.push_back(obj);
    return true;
}